

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_> __thiscall
wabt::anon_unknown_15::CodeMetadataExprQueue::pop_match
          (CodeMetadataExprQueue *this,Func *f,Offset offset)

{
  bool bVar1;
  pointer pCVar2;
  size_t in_RCX;
  Location local_60;
  reference local_40;
  value_type *current_metadata;
  value_type *current_entry;
  size_t local_28;
  Offset offset_local;
  Func *f_local;
  CodeMetadataExprQueue *this_local;
  unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_> *ret;
  
  current_entry._7_1_ = 0;
  local_28 = in_RCX;
  offset_local = offset;
  f_local = f;
  this_local = this;
  std::unique_ptr<wabt::CodeMetadataExpr,std::default_delete<wabt::CodeMetadataExpr>>::
  unique_ptr<std::default_delete<wabt::CodeMetadataExpr>,void>
            ((unique_ptr<wabt::CodeMetadataExpr,std::default_delete<wabt::CodeMetadataExpr>> *)this)
  ;
  bVar1 = std::
          deque<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
          ::empty((deque<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                   *)f);
  if ((!bVar1) &&
     (current_metadata =
           (value_type *)
           std::
           deque<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ::front((deque<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                    *)f), ((reference)current_metadata)->func == (Func *)offset_local)) {
    bVar1 = std::
            deque<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
            ::empty(&((reference)current_metadata)->func_queue);
    if (bVar1) {
      std::
      deque<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
      ::pop_front((deque<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                   *)f);
    }
    else {
      local_40 = std::
                 deque<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
                 ::front((deque<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
                          *)(current_metadata + 1));
      pCVar2 = std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
               ::operator->(local_40);
      if ((pCVar2->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1.field_1.offset +
          *(long *)&(current_metadata->_M_t).
                    super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
                    .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl[3].data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl ==
          local_28) {
        Location::Location(&local_60,local_28);
        pCVar2 = std::
                 unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>::
                 operator->(local_40);
        (pCVar2->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.filename._M_len =
             local_60.filename._M_len;
        (pCVar2->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.filename._M_str =
             local_60.filename._M_str;
        (pCVar2->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1.field_1.offset =
             (size_t)local_60.field_1.field_1.offset;
        *(undefined8 *)
         ((long)&(pCVar2->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1 + 8) =
             local_60.field_1._8_8_;
        std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>::
        operator=((unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
                   *)this,local_40);
        std::
        deque<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
        ::pop_front((deque<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>,_std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>_>_>
                     *)(current_metadata + 1));
      }
    }
  }
  return (__uniq_ptr_data<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>,_true,_true>
          )(__uniq_ptr_data<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CodeMetadataExpr> pop_match(Func* f, Offset offset) {
    std::unique_ptr<CodeMetadataExpr> ret;
    if (entries.empty()) {
      return ret;
    }

    auto& current_entry = entries.front();

    if (current_entry.func != f)
      return ret;
    if (current_entry.func_queue.empty()) {
      entries.pop_front();
      return ret;
    }

    auto& current_metadata = current_entry.func_queue.front();
    if (current_metadata->loc.offset + current_entry.func->loc.offset !=
        offset) {
      return ret;
    }

    current_metadata->loc = Location(offset);
    ret = std::move(current_metadata);
    current_entry.func_queue.pop_front();

    return ret;
  }